

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O2

int Fra_FraigMiterStatus(Aig_Man_t *p)

{
  Aig_Obj_t *pAVar1;
  uint uVar2;
  void *pvVar3;
  int i;
  int iVar4;
  int iVar5;
  
  if (p->pData != (void *)0x0) {
    return 0;
  }
  i = 0;
  iVar5 = 0;
  iVar4 = 0;
  do {
    if (p->nObjs[3] - p->nRegs <= i) {
      uVar2 = 0;
      if (iVar5 == 0) {
        uVar2 = -(uint)(iVar4 != 0) | 1;
      }
      return uVar2;
    }
    pvVar3 = Vec_PtrEntry(p->vCos,i);
    pAVar1 = *(Aig_Obj_t **)((long)pvVar3 + 8);
    if (pAVar1 != (Aig_Obj_t *)((ulong)p->pConst1 ^ 1)) {
      if (pAVar1 != p->pConst1) {
        uVar2 = (uint)*(undefined8 *)((int *)((ulong)pAVar1 & 0xfffffffffffffffe) + 6);
        if ((((uVar2 & 7) != 2) || (p->nTruePis <= *(int *)((ulong)pAVar1 & 0xfffffffffffffffe))) &&
           ((((uint)pAVar1 ^ uVar2 >> 3) & 1) == 0)) {
          iVar4 = iVar4 + 1;
          goto LAB_004d3c45;
        }
      }
      iVar5 = iVar5 + 1;
    }
LAB_004d3c45:
    i = i + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

/* 
    Speculating reduction in the sequential case leads to an interesting 
    situation when a counter-ex may not refine any classes. This happens
    for non-constant equivalence classes. In such cases the representative
    of the class (proved by simulation to be non-constant) may be reduced 
    to a constant during the speculative reduction. The fraig-representative 
    of this representative node is a constant node, even though this is a 
    non-constant class. Experiments have shown that this situation happens 
    very often at the beginning of the refinement iteration when there are 
    many spurious candidate equivalence classes (especially if heavy-duty 
    simulatation of BMC was node used at the beginning). As a result, the 
    SAT solver run may return a counter-ex that  distinguishes the given 
    representative node from the constant-1 node but this counter-ex
    does not distinguish the nodes in the non-costant class... This is why 
    there is no check of refinement after a counter-ex in the sequential case.
*/

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reports the status of the miter.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Fra_FraigMiterStatus( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pChild;
    int i, CountConst0 = 0, CountNonConst0 = 0, CountUndecided = 0;
    if ( p->pData )
        return 0;
    Aig_ManForEachPoSeq( p, pObj, i )
    {
        pChild = Aig_ObjChild0(pObj);
        // check if the output is constant 0
        if ( pChild == Aig_ManConst0(p) )
        {
            CountConst0++;
            continue;
        }
        // check if the output is constant 1
        if ( pChild == Aig_ManConst1(p) )
        {
            CountNonConst0++;
            continue;
        }
        // check if the output is a primary input
        if ( Aig_ObjIsCi(Aig_Regular(pChild)) && Aig_ObjCioId(Aig_Regular(pChild)) < p->nTruePis )
        {
            CountNonConst0++;
            continue;
        }
        // check if the output can be not constant 0
        if ( Aig_Regular(pChild)->fPhase != (unsigned)Aig_IsComplement(pChild) )
        {
            CountNonConst0++;
            continue;
        }
        CountUndecided++;
    }
/*
    if ( p->pParams->fVerbose )
    {
        printf( "Miter has %d outputs. ", Aig_ManCoNum(p->pManAig) );
        printf( "Const0 = %d.  ", CountConst0 );
        printf( "NonConst0 = %d.  ", CountNonConst0 );
        printf( "Undecided = %d.  ", CountUndecided );
        printf( "\n" );
    }
*/
    if ( CountNonConst0 )
        return 0;
    if ( CountUndecided )
        return -1;
    return 1;
}